

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 SyHashInsert(SyHash *pHash,void *pKey,sxu32 nKeyLen,void *pUserData)

{
  SyHashEntry_Pr *pSVar1;
  sxu32 sVar2;
  sxi32 sVar3;
  SyHashEntry_Pr **ppSVar4;
  SyHashEntry_Pr **ppSVar5;
  SyHashEntry_Pr *pSVar6;
  ulong uVar7;
  uint uVar8;
  SyHashEntry_Pr **ppSVar9;
  uint uVar10;
  
  uVar8 = pHash->nBucketSize;
  if (uVar8 * 3 <= pHash->nEntry) {
    ppSVar4 = (SyHashEntry_Pr **)SyMemBackendAlloc(pHash->pAllocator,uVar8 << 4);
    if (ppSVar4 != (SyHashEntry_Pr **)0x0) {
      if ((uVar8 & 0xfffffff) != 0) {
        ppSVar5 = (SyHashEntry_Pr **)((long)ppSVar4 + (ulong)(uVar8 << 4));
        ppSVar9 = ppSVar4;
        do {
          *(undefined1 *)ppSVar9 = 0;
          if (ppSVar5 <= (SyHashEntry_Pr **)((long)ppSVar9 + 1)) break;
          *(undefined1 *)((long)ppSVar9 + 1) = 0;
          if (ppSVar5 <= (SyHashEntry_Pr **)((long)ppSVar9 + 2)) break;
          *(undefined1 *)((long)ppSVar9 + 2) = 0;
          if (ppSVar5 <= (SyHashEntry_Pr **)((long)ppSVar9 + 3)) break;
          *(undefined1 *)((long)ppSVar9 + 3) = 0;
          ppSVar9 = (SyHashEntry_Pr **)((long)ppSVar9 + 4);
        } while (ppSVar9 < ppSVar5);
      }
      sVar2 = pHash->nEntry;
      if (sVar2 != 0) {
        ppSVar9 = &pHash->pList;
        do {
          pSVar6 = *ppSVar9;
          pSVar6->pNextCollide = (SyHashEntry_Pr *)0x0;
          pSVar6->pPrevCollide = (SyHashEntry_Pr *)0x0;
          uVar10 = pSVar6->nHash & uVar8 * 2 - 1;
          pSVar1 = ppSVar4[uVar10];
          pSVar6->pNextCollide = pSVar1;
          if (pSVar1 != (SyHashEntry_Pr *)0x0) {
            pSVar1->pPrevCollide = pSVar6;
          }
          ppSVar4[uVar10] = pSVar6;
          ppSVar9 = &pSVar6->pNext;
          sVar2 = sVar2 - 1;
        } while (sVar2 != 0);
      }
      SyMemBackendFree(pHash->pAllocator,pHash->apBucket);
      pHash->apBucket = ppSVar4;
      pHash->nBucketSize = uVar8 * 2;
    }
  }
  pSVar6 = (SyHashEntry_Pr *)SyMemBackendPoolAlloc(pHash->pAllocator,0x48);
  if (pSVar6 == (SyHashEntry_Pr *)0x0) {
    sVar3 = -1;
  }
  else {
    uVar7 = 0xfffffffffffffffc;
    do {
      *(undefined4 *)((long)&pSVar6->pKey + uVar7 + 4) = 0;
      uVar7 = uVar7 + 4;
    } while (uVar7 < 0x44);
    pSVar6->pHash = pHash;
    pSVar6->pKey = pKey;
    pSVar6->nKeyLen = nKeyLen;
    pSVar6->pUserData = pUserData;
    sVar2 = (*pHash->xHash)(pKey,nKeyLen);
    pSVar6->nHash = sVar2;
    uVar8 = pHash->nBucketSize - 1 & sVar2;
    ppSVar4 = pHash->apBucket;
    pSVar1 = ppSVar4[uVar8];
    pSVar6->pNextCollide = pSVar1;
    if (pSVar1 != (SyHashEntry_Pr *)0x0) {
      pSVar1->pPrevCollide = pSVar6;
    }
    ppSVar4[uVar8] = pSVar6;
    pSVar1 = pHash->pList;
    if (pSVar1 != (SyHashEntry_Pr *)0x0) {
      pSVar6->pNext = pSVar1;
      pSVar1->pPrev = pSVar6;
    }
    pHash->pList = pSVar6;
    if (pHash->nEntry == 0) {
      pHash->pCurrent = pSVar6;
    }
    pHash->nEntry = pHash->nEntry + 1;
    sVar3 = 0;
  }
  return sVar3;
}

Assistant:

JX9_PRIVATE sxi32 SyHashInsert(SyHash *pHash, const void *pKey, sxu32 nKeyLen, void *pUserData)
{
	SyHashEntry_Pr *pEntry;
	sxi32 rc;
#if defined(UNTRUST)
	if( INVALID_HASH(pHash) || pKey == 0 ){
		return SXERR_CORRUPT;
	}
#endif
	if( pHash->nEntry >= pHash->nBucketSize * SXHASH_FILL_FACTOR ){
		rc = HashGrowTable(&(*pHash));
		if( rc != SXRET_OK ){
			return rc;
		}
	}
	/* Allocate a new hash entry */
	pEntry = (SyHashEntry_Pr *)SyMemBackendPoolAlloc(pHash->pAllocator, sizeof(SyHashEntry_Pr));
	if( pEntry == 0 ){
		return SXERR_MEM;
	}
	/* Zero the entry */
	SyZero(pEntry, sizeof(SyHashEntry_Pr));
	pEntry->pHash = pHash;
	pEntry->pKey = pKey;
	pEntry->nKeyLen = nKeyLen;
	pEntry->pUserData = pUserData;
	pEntry->nHash = pHash->xHash(pEntry->pKey, pEntry->nKeyLen);
	/* Finally insert the entry in its corresponding bucket */
	rc = HashInsert(&(*pHash), pEntry);
	return rc;
}